

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall CLIntercept::removeMapPointer(CLIntercept *this,void *ptr)

{
  void *local_18;
  
  if (ptr != (void *)0x0) {
    local_18 = ptr;
    std::mutex::lock(&this->m_Mutex);
    std::
    _Rb_tree<const_void_*,_std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>,_std::_Select1st<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_CLIntercept::SMapPointerInfo>_>_>
    ::erase(&(this->m_MapPointerInfoMap)._M_t,&local_18);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::removeMapPointer(
    const void* ptr )
{
    if( ptr )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);
        m_MapPointerInfoMap.erase(ptr);
    }
}